

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O1

mcpl_file_t mcpl_actual_open_file(char *filename,int *repair_status)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  mcpl_fileinternal_t *f;
  char *pcVar4;
  MCTOOLS_FILE_t *pMVar5;
  ulong uVar6;
  size_t sVar7;
  uint64_t uVar8;
  char **ppcVar9;
  uint64_t uVar10;
  uint32_t *puVar11;
  mcpl_particle_t *pmVar12;
  ulong extraout_RAX;
  mcpl_file_t mVar13;
  long lVar14;
  long lVar15;
  uchar start [8];
  uint64_t numpart;
  uint32_t arr [8];
  char testbuf [4];
  undefined8 uStack_80;
  int local_78;
  byte local_74;
  byte local_73;
  byte local_72;
  char local_71;
  int *local_70;
  int local_64;
  uint64_t local_60;
  mcu8str local_58;
  uint local_40;
  int local_3c;
  undefined1 local_34 [4];
  
  iVar1 = *repair_status;
  *repair_status = 0;
  local_70 = repair_status;
  if (filename == (char *)0x0) {
    pcVar4 = "mcpl_open_file called with null string";
    goto LAB_0010346e;
  }
  uStack_80 = (code *)0x102f2c;
  f = (mcpl_fileinternal_t *)mcpl_internal_calloc(1,0x100);
  f->file = (FILE *)0x0;
  f->filegz = (gzFile)0x0;
  uStack_80 = (code *)0x102f44;
  pcVar4 = strrchr(filename,0x2e);
  if (pcVar4 == (char *)0x0) {
LAB_00102f5c:
    uStack_80 = (code *)0x102f6c;
    mcu8str_view_cstr(&local_58,filename);
    uStack_80 = (code *)0x102f7b;
    pMVar5 = mctools_fopen(&local_58,"rb");
    f->file = pMVar5;
  }
  else {
    uStack_80 = (code *)0x102f58;
    iVar3 = strcmp(pcVar4,".gz");
    if (iVar3 != 0) goto LAB_00102f5c;
    uStack_80 = (code *)0x102f8f;
    pMVar5 = (MCTOOLS_FILE_t *)mcpl_gzopen(filename,"rb");
    f->filegz = (gzFile)pMVar5;
  }
  if (pMVar5 == (MCTOOLS_FILE_t *)0x0) {
    uStack_80 = (code *)0x103467;
    mcpl_internal_cleanup_file(f);
    pcVar4 = "Unable to open file!";
    goto LAB_0010346e;
  }
  if (f->filegz == (gzFile)0x0) {
    uStack_80 = (code *)0x102fcb;
    uVar6 = fread(&local_78,1,8,(FILE *)f->file);
  }
  else {
    uStack_80 = (code *)0x102fb2;
    iVar3 = gzread(f->filegz,&local_78,8);
    uVar6 = (ulong)iVar3;
  }
  if ((3 < uVar6) && (local_78 != 0x4c50434d)) {
    pcVar4 = "File is not an MCPL file!";
    goto LAB_0010346e;
  }
  if (uVar6 != 8) {
    pcVar4 = "Error while reading first bytes of file!";
    goto LAB_0010346e;
  }
  iVar3 = (uint)local_74 * 100 + ((uint)local_73 + (uint)local_73 * 4) * 2;
  f->format_version = ((uint)local_72 + iVar3) - 0x14d0;
  if ((iVar3 + (uint)local_72 & 0xfffffffe) != 0x14d2) {
    pcVar4 = "File is in an unsupported MCPL version!";
    goto LAB_0010346e;
  }
  local_58.c_str._0_4_ = 0x1234567;
  f->is_little_endian = 1;
  if (local_71 != 'L') {
    if (local_71 == 'B') {
      pcVar4 = "Endian-ness of current platform is different than the one used to write the file.";
    }
    else {
      pcVar4 = "Unexpected value in endianness field!";
    }
    goto LAB_0010346e;
  }
  if (f->filegz == (gzFile)0x0) {
    uStack_80 = (code *)0x10306c;
    sVar7 = fread(&local_60,1,8,(FILE *)f->file);
  }
  else {
    uStack_80 = (code *)0x103051;
    iVar3 = gzread(f->filegz,&local_60,8);
    sVar7 = (size_t)iVar3;
  }
  if (sVar7 == 8) {
    f->nparticles = local_60;
    if (f->filegz == (gzFile)0x0) {
      uStack_80 = (code *)0x1030b2;
      sVar7 = fread(&local_58,1,0x20,(FILE *)f->file);
    }
    else {
      uStack_80 = (code *)0x103097;
      iVar3 = gzread(f->filegz,&local_58,0x20);
      sVar7 = (size_t)iVar3;
    }
    if (sVar7 == 0x20) {
      f->ncomments = (uint32_t)local_58.c_str;
      f->nblobs = local_58.c_str._4_4_;
      f->opt_userflags = local_58.size;
      f->opt_polarisation = local_58.buflen;
      f->opt_singleprec = local_58.owns_memory;
      f->opt_universalpdgcode = local_58._20_4_;
      f->particle_size = local_40;
      if (0x60 < local_40) {
        pcVar4 = "unexpected particle size";
        goto LAB_0010346e;
      }
      if (local_3c == 0) {
        lVar14 = 0x30;
      }
      else {
        if (f->filegz == (gzFile)0x0) {
          uStack_80 = (code *)0x103127;
          sVar7 = fread(&f->opt_universalweight,1,8,(FILE *)f->file);
        }
        else {
          uStack_80 = (code *)0x103106;
          iVar3 = gzread(f->filegz,&f->opt_universalweight,8);
          sVar7 = (size_t)iVar3;
        }
        lVar14 = 0x38;
        if (sVar7 != 8) goto LAB_00103412;
      }
      f->opt_signature =
           f->opt_userflags * 0x10 +
           f->opt_polarisation * 2 + f->opt_singleprec + (uint)(f->opt_universalpdgcode != 0) * 4 +
           (-(uint)(f->opt_universalweight != 0.0) & 1) * 8;
      uStack_80 = (code *)0x103184;
      uVar8 = mcpl_read_string(f,&f->hdr_srcprogname,
                               "Errors encountered while attempting to read header");
      if ((ulong)f->ncomments == 0) {
        ppcVar9 = (char **)0x0;
      }
      else {
        uStack_80 = (code *)0x103199;
        ppcVar9 = (char **)mcpl_internal_calloc((ulong)f->ncomments,8);
      }
      uVar8 = uVar8 + lVar14;
      f->comments = ppcVar9;
      local_64 = iVar1;
      if (f->ncomments != 0) {
        lVar14 = 0;
        uVar6 = 0;
        do {
          uStack_80 = (code *)0x1031cd;
          uVar10 = mcpl_read_string(f,(char **)((long)f->comments + lVar14),
                                    "Errors encountered while attempting to read header");
          uVar8 = uVar8 + uVar10;
          uVar6 = uVar6 + 1;
          lVar14 = lVar14 + 8;
        } while (uVar6 < f->ncomments);
      }
      f->blobkeys = (char **)0x0;
      f->bloblengths = (uint32_t *)0x0;
      f->blobs = (char **)0x0;
      if ((ulong)f->nblobs != 0) {
        uStack_80 = (code *)0x103206;
        ppcVar9 = (char **)mcpl_internal_calloc((ulong)f->nblobs,8);
        f->blobs = ppcVar9;
        uStack_80 = (code *)0x103217;
        ppcVar9 = (char **)mcpl_internal_calloc((ulong)f->nblobs,8);
        f->blobkeys = ppcVar9;
        uStack_80 = (code *)0x103228;
        puVar11 = (uint32_t *)mcpl_internal_calloc((ulong)f->nblobs,4);
        f->bloblengths = puVar11;
        if (f->nblobs != 0) {
          lVar14 = 0;
          uVar6 = 0;
          do {
            uStack_80 = (code *)0x103251;
            uVar10 = mcpl_read_string(f,(char **)((long)f->blobkeys + lVar14),
                                      "Errors encountered while attempting to read header");
            uVar8 = uVar8 + uVar10;
            uVar6 = uVar6 + 1;
            lVar14 = lVar14 + 8;
          } while (uVar6 < f->nblobs);
        }
        if (f->nblobs != 0) {
          lVar15 = 0;
          lVar14 = 0;
          uVar6 = 0;
          do {
            uStack_80 = (code *)0x103291;
            uVar10 = mcpl_read_buffer(f,(uint *)((long)f->bloblengths + lVar14),
                                      (char **)((long)f->blobs + lVar15),
                                      "Errors encountered while attempting to read header");
            uVar8 = uVar8 + uVar10;
            uVar6 = uVar6 + 1;
            lVar14 = lVar14 + 4;
            lVar15 = lVar15 + 8;
          } while (uVar6 < f->nblobs);
        }
      }
      uStack_80 = (code *)0x1032b6;
      pmVar12 = (mcpl_particle_t *)mcpl_internal_calloc(1,0x68);
      iVar1 = local_64;
      f->particle = pmVar12;
      f->current_particle_idx = 0;
      f->first_particle_pos = uVar8;
      if (local_64 == 0 && f->nparticles != 0) {
        return (mcpl_file_t)f;
      }
      if (f->filegz == (gzFile)0x0) {
        if ((FILE *)f->file != (FILE *)0x0) {
          uStack_80 = (code *)0x10332f;
          iVar3 = fseek((FILE *)f->file,0,2);
          if (iVar3 == 0) {
            uStack_80 = (code *)0x10333f;
            lVar14 = ftell((FILE *)f->file);
            uVar6 = lVar14 - f->first_particle_pos;
            if (uVar6 != 0 && (long)f->first_particle_pos <= lVar14) {
              uVar6 = uVar6 / f->particle_size;
              uVar2 = f->nparticles;
              if (uVar2 != uVar6) {
                if ((uVar2 != 0) && (uVar2 < uVar6)) {
                  uStack_80 = (code *)0x1034b1;
                  mcpl_error("Input file has invalid combination of meta-data & filesize.");
LAB_001034b1:
                  pcVar4 = "unexpected nparticles value";
                  uStack_80 = mcpl_open_file;
                  mcpl_error("unexpected nparticles value");
                  uStack_80 = (code *)(extraout_RAX & 0xffffffff);
                  mVar13 = mcpl_actual_open_file(pcVar4,(int *)((long)&uStack_80 + 4));
                  return (mcpl_file_t)mVar13.internal;
                }
                if (iVar1 == 0) {
                  if (f->nparticles != 0) goto LAB_001034b1;
                  uStack_80 = (code *)0x1033eb;
                  printf("MCPL WARNING: Input file appears to not have been closed properly. Recovered %lu particles.\n"
                         ,uVar6);
                }
                else {
                  *local_70 = 3;
                }
                f->nparticles = uVar6;
              }
            }
          }
        }
        uStack_80 = (code *)0x103400;
        fseek((FILE *)f->file,f->first_particle_pos,0);
        return (mcpl_file_t)f;
      }
      if (f->nparticles == 0) {
        uStack_80 = (code *)0x103392;
        iVar3 = gzread(f->filegz,local_34,4);
        if (iVar3 != 0) {
          if (iVar1 == 0) {
            pcVar4 = 
            "Input file appears to not have been closed properly and data recovery is disabled for gzipped files."
            ;
            goto LAB_0010346e;
          }
          *local_70 = 1;
        }
      }
      else {
        if (local_64 == 0) {
          pcVar4 = "logic error (!caller_is_mcpl_repair)";
          goto LAB_0010346e;
        }
        *local_70 = 2;
      }
      uVar8 = f->first_particle_pos;
      uStack_80 = (code *)0x1033be;
      uVar10 = gzseek64(f->filegz,uVar8,0);
      if (uVar10 == uVar8) {
        return (mcpl_file_t)f;
      }
      pcVar4 = "Unexpected issue skipping to start of empty gzipped file";
      goto LAB_0010346e;
    }
  }
LAB_00103412:
  pcVar4 = "Errors encountered while attempting to read header";
LAB_0010346e:
  uStack_80 = (code *)0x103474;
  (*mcpl_error_handler)(pcVar4);
  uStack_80 = (code *)0x103489;
  printf("MCPL ERROR: %s\n",
         "Handler given to mcpl_set_error_handler returns to calling code which is not allowed!");
  uStack_80 = (code *)0x103493;
  exit(1);
}

Assistant:

MCPL_LOCAL mcpl_file_t mcpl_actual_open_file(const char * filename, int * repair_status)
{
  int caller_is_mcpl_repair = *repair_status;
  *repair_status = 0;//file not broken

  if (!filename)
    mcpl_error("mcpl_open_file called with null string");

  mcpl_platform_compatibility_check();

  mcpl_file_t out;
  out.internal = NULL;

  mcpl_fileinternal_t * f
    = (mcpl_fileinternal_t*)mcpl_internal_calloc(1,sizeof(mcpl_fileinternal_t));

  //open file (with gzopen if filename ends with .gz):
  f->file = NULL;
  f->filegz = NULL;
  const char * lastdot = strrchr(filename, '.');
  if (lastdot && strcmp(lastdot, ".gz") == 0) {
    f->filegz = mcpl_gzopen( filename, "rb" );
    if (!f->filegz) {
      mcpl_internal_cleanup_file(f);
      mcpl_error("Unable to open file!");
    }
  } else {
    f->file = mcpl_internal_fopen(filename,"rb");
    if (!f->file) {
      mcpl_internal_cleanup_file(f);
      mcpl_error("Unable to open file!");
    }
  }

  //First read and check magic word, format version and endianness.
  unsigned char start[8];// = {'M','C','P','L','0','0','0','L'};
  size_t nb;
  if (f->filegz)
    nb = gzread(f->filegz, start, sizeof(start));
  else
    nb = fread(start, 1, sizeof(start), f->file);
  if (nb>=4&&(start[0]!='M'||start[1]!='C'||start[2]!='P'||start[3]!='L'))
    mcpl_error("File is not an MCPL file!");
  if (nb!=sizeof(start))
    mcpl_error("Error while reading first bytes of file!");
  f->format_version = (start[4]-'0')*100 + (start[5]-'0')*10 + (start[6]-'0');
  if (f->format_version!=2&&f->format_version!=3)
    mcpl_error("File is in an unsupported MCPL version!");
  f->is_little_endian = mcpl_platform_is_little_endian();
  if (start[7]!=(f->is_little_endian?'L':'B')) {
    if (start[7]=='L'||start[7]=='B')
      mcpl_error("Endian-ness of current platform is different than the one used to write the file.");
    else
      mcpl_error("Unexpected value in endianness field!");
  }
  int64_t current_pos = sizeof(start);

  //proceed reading header, knowing we have a consistent version and endian-ness.
  const char * errmsg = "Errors encountered while attempting to read header";

  uint64_t numpart;
  if (f->filegz)
    nb = gzread(f->filegz, &numpart, sizeof(numpart));
  else
    nb = fread(&numpart, 1, sizeof(numpart), f->file);
  if (nb!=sizeof(numpart))
    mcpl_error(errmsg);
  current_pos += nb;
  f->nparticles = numpart;

  uint32_t arr[8];
  MCPL_STATIC_ASSERT(sizeof(arr)==32);
  if (f->filegz)
    nb = gzread(f->filegz, arr, sizeof(arr));
  else
    nb=fread(arr, 1, sizeof(arr), f->file);
  if (nb!=sizeof(arr))
    mcpl_error(errmsg);
  current_pos += nb;

  f->ncomments = arr[0];
  f->nblobs = arr[1];
  f->opt_userflags = arr[2];
  f->opt_polarisation = arr[3];
  f->opt_singleprec = arr[4];
  f->opt_universalpdgcode = (int32_t)arr[5];
  f->particle_size = arr[6];//We could check consistency here with the calculated value.
  if ( ! (f->particle_size<=MCPLIMP_MAX_PARTICLE_SIZE) )
    mcpl_error("unexpected particle size");

  if (arr[7]) {
    //file has universal weight
    if (f->filegz)
      nb = gzread(f->filegz, (void*)&(f->opt_universalweight), sizeof(f->opt_universalweight));
    else
      nb=fread((void*)&(f->opt_universalweight), 1, sizeof(f->opt_universalweight), f->file);
    if (nb!=sizeof(f->opt_universalweight))
      mcpl_error(errmsg);
    current_pos += nb;
  }

  f->opt_signature = 0
    + 1 * f->opt_singleprec
    + 2 * f->opt_polarisation
    + 4 * (f->opt_universalpdgcode?1:0)
    + 8 * (f->opt_universalweight?1:0)
    + 16 * f->opt_userflags;

  //Then some strings:
  current_pos += mcpl_read_string(f,&f->hdr_srcprogname,errmsg);
  f->comments = ( f->ncomments
                  ? (char **)mcpl_internal_calloc(f->ncomments,sizeof(char*))
                  : NULL );
  uint32_t i;
  for (i = 0; i < f->ncomments; ++i)
    current_pos += mcpl_read_string(f,&(f->comments[i]),errmsg);

  f->blobkeys = NULL;
  f->bloblengths = 0;
  f->blobs = NULL;
  if (f->nblobs) {
    f->blobs = (char **)mcpl_internal_calloc(f->nblobs,sizeof(char*));
    f->blobkeys = (char **)mcpl_internal_calloc(f->nblobs,sizeof(char*));
    f->bloblengths = (uint32_t *)mcpl_internal_calloc(f->nblobs,sizeof(uint32_t));
    for (i =0; i < f->nblobs; ++i)
      current_pos += mcpl_read_string(f,&(f->blobkeys[i]),errmsg);
    for (i =0; i < f->nblobs; ++i)
      current_pos += mcpl_read_buffer(f, &(f->bloblengths[i]), &(f->blobs[i]), errmsg);
  }
  f->particle = (mcpl_particle_t*)mcpl_internal_calloc(1,sizeof(mcpl_particle_t));

  //At first event now:
  f->current_particle_idx = 0;
  f->first_particle_pos = current_pos;

  if ( f->nparticles==0 || caller_is_mcpl_repair ) {
    //TODO: Perhaps the placeholder nparticles should be UINT64_MAX instead of
    //0, so we know that nparticles=0 is a properly closed file.

    //Although empty files are permitted, it is possible that the file was never
    //closed properly (maybe the writing program ended prematurely). Let us
    //check to possibly recover usage of the file. If caller is mcpl_repair, we
    //always check since the file might have been truncated after it was first
    //closed properly.
    if (f->filegz) {
      //SEEK_END is not supported by zlib, and there is no reliable way to get
      //the input size. Thus, all we can do is to uncompress the whole thing,
      //which we won't since it might stall operations for a long time. But we
      //can at least try to check whether the file is indeed empty or not, and
      //give an error in the latter case:
      if (f->nparticles==0) {
        char testbuf[4];
        nb = gzread(f->filegz, testbuf, sizeof(testbuf));
        if (nb>0) {
          if (caller_is_mcpl_repair) {
            *repair_status = 1;//file broken but can't recover since gzip.
          } else {
            mcpl_error("Input file appears to not have been closed properly"
                       " and data recovery is disabled for gzipped files.");
          }
        }
      } else {
        if (!caller_is_mcpl_repair)
          mcpl_error("logic error (!caller_is_mcpl_repair)");
        *repair_status = 2;//file brokenness can not be determined since gzip.
      }
      if (!mcpl_gzseek( f->filegz, f->first_particle_pos ) )
        mcpl_error("Unexpected issue skipping to start of empty gzipped file");
    } else {
      //SEEK_END is not guaranteed to always work, so we fail our recovery
      //attempt silently:
      if (f->file && !MCPL_FSEEK_END( f->file )) {
        int64_t endpos = MCPL_FTELL(f->file);
        if (endpos > (int64_t)f->first_particle_pos && (uint64_t)endpos != f->first_particle_pos) {
          uint64_t np = ( endpos - f->first_particle_pos ) / f->particle_size;
          if ( f->nparticles != np ) {
            if ( f->nparticles > 0 && np > f->nparticles ) {
              //should really not happen unless file was corrupted or file was
              //first closed properly and then something was appended to it.
              mcpl_error("Input file has invalid combination of meta-data & filesize.");
            }
            if (caller_is_mcpl_repair) {
              *repair_status = 3;//file broken and should be able to repair
            } else {
              if (f->nparticles!=0)
                mcpl_error("unexpected nparticles value");
              printf("MCPL WARNING: Input file appears to not have been"
                     " closed properly. Recovered %" PRIu64 " particles.\n",np);
            }
            f->nparticles = np;
          }
        }
      }
      MCPL_FSEEK( f->file, f->first_particle_pos );//if this fseek failed, it
                                                   //might just be that we are
                                                   //at EOF with no particles.
    }
  }

  out.internal = f;
  return out;
}